

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap,Index columnIndex)

{
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  *plVar1;
  Matrix_entry *entry;
  ID_index rowIndex;
  const_reference pvVar2;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  *plVar3;
  
  plVar1 = (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
            *)(this + 0x28);
  plVar3 = plVar1;
  while (plVar3 = *(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                    **)plVar3, plVar3 != plVar1) {
    entry = (Matrix_entry *)(plVar3 + -0x18);
    Row_access<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
    ::unlink((Row_access<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
              *)this,(char *)entry);
    if (columnIndex != 0xffffffff) {
      (entry->super_Entry_column_index_option).columnIndex_ = columnIndex;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (valueMap,(ulong)*(uint *)(plVar3 + 0x10));
    rowIndex = *pvVar2;
    *(ID_index *)(plVar3 + 0x10) = rowIndex;
    Row_access<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
    ::insert_entry((Row_access<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                    *)this,rowIndex,entry);
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  sort<std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>>
            (plVar1);
  return;
}

Assistant:

inline void Intrusive_list_column<Master_matrix>::reorder(const Row_index_map& valueMap,
                                                          [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  for (auto it = column_.begin(); it != column_.end(); ++it) {
    Entry* entry = &(*it);
    if constexpr (Master_matrix::Option_list::has_row_access) {
      RA_opt::unlink(entry);
      if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
    }
    entry->set_row_index(valueMap.at(entry->get_row_index()));
    if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
      RA_opt::insert_entry(entry->get_row_index(), entry);
  }

  // all entries have to be deleted first, to avoid problem with insertion when row is a set
  if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
    for (auto it = column_.begin(); it != column_.end(); ++it) {
      Entry* entry = &(*it);
      RA_opt::insert_entry(entry->get_row_index(), entry);
    }
  }

  column_.sort();
}